

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOAnalyzer.cpp
# Opt level: O3

void __thiscall MDIOAnalyzer::AdvanceToStartFrame(MDIOAnalyzer *this)

{
  AnalyzerChannelData *pAVar1;
  int iVar2;
  
  iVar2 = AnalyzerChannelData::GetBitState();
  if (iVar2 == 0) {
    AnalyzerHelpers::Assert("AdvanceToStartFrame() must be called with MDIO line with HIGH state");
  }
  AnalyzerChannelData::AdvanceToNextEdge();
  pAVar1 = this->mMdc;
  AnalyzerChannelData::GetSampleNumber();
  AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)pAVar1);
  iVar2 = AnalyzerChannelData::GetBitState();
  if (iVar2 == 1) {
    AnalyzerChannelData::AdvanceToNextEdge();
    return;
  }
  return;
}

Assistant:

void MDIOAnalyzer::AdvanceToStartFrame()
{
    if( mMdio->GetBitState() == BIT_LOW )
    {
        AnalyzerHelpers::Assert( "AdvanceToStartFrame() must be called with MDIO line with HIGH state" );
    }

    mMdio->AdvanceToNextEdge(); // high->low transition
    mMdc->AdvanceToAbsPosition( mMdio->GetSampleNumber() );
    if( mMdc->GetBitState() == BIT_HIGH )
        mMdc->AdvanceToNextEdge();
}